

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools.hpp
# Opt level: O2

string * CLI::detail::fix_newlines(string *__return_storage_ptr__,string *leader,string *input)

{
  size_type sVar1;
  ulong __pos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __pos = 0;
  while ((__pos != 0xffffffffffffffff && (__pos < input->_M_string_length))) {
    sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      (input,'\n',__pos);
    __pos = 0xffffffffffffffff;
    if (sVar1 != 0xffffffffffffffff) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_b0,input,0,sVar1 + 1);
      ::std::operator+(&local_70,&local_b0,leader);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_90,input,sVar1 + 1,0xffffffffffffffff);
      ::std::operator+(&local_50,&local_70,&local_90);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (input,&local_50);
      ::std::__cxx11::string::~string((string *)&local_50);
      ::std::__cxx11::string::~string((string *)&local_90);
      ::std::__cxx11::string::~string((string *)&local_70);
      ::std::__cxx11::string::~string((string *)&local_b0);
      __pos = sVar1 + leader->_M_string_length;
    }
  }
  ::std::__cxx11::string::string(__return_storage_ptr__,input);
  return __return_storage_ptr__;
}

Assistant:

inline std::string fix_newlines(const std::string &leader, std::string input) {
    std::string::size_type n = 0;
    while(n != std::string::npos && n < input.size()) {
        n = input.find('\n', n);
        if(n != std::string::npos) {
            input = input.substr(0, n + 1) + leader + input.substr(n + 1);
            n += leader.size();
        }
    }
    return input;
}